

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test::TestBody
          (TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test *this)

{
  database *db;
  mutex_type *pmVar1;
  database_reference pdVar2;
  test_trie *ptVar3;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar4;
  pointer pcVar5;
  uint generation;
  value_reference_type ppVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  iterator_base<false> *piVar8;
  pointer *__ptr_2;
  char *pcVar9;
  char *in_R9;
  pointer *__ptr_3;
  pointer *__ptr;
  string v6;
  string v7;
  pointer *__ptr_1;
  string v5;
  transaction_type t1;
  undefined1 local_690 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  AssertHelper local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  AssertHelper local_660;
  undefined1 local_658 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  AssertHelper local_638;
  default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_630;
  undefined1 local_628 [8];
  index_pointer local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618 [13];
  __uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_540;
  bool local_538;
  transaction<std::unique_lock<mock_mutex>_> local_530;
  undefined1 local_4f8 [8];
  index_pointer local_4f0;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_418;
  __uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8 [13];
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_328;
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_320;
  bool local_318;
  undefined1 local_310 [232];
  __uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  undefined1 local_220 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_138;
  undefined1 local_128 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_40;
  
  db = &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_;
  local_408._0_8_ =
       &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
        field_0x10;
  local_408[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_408);
  local_408[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_530,db,(unique_lock<mock_mutex> *)local_408);
  ptVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  pmVar1 = (mutex_type *)(local_408 + 0x10);
  local_408._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"b","");
  anon_unknown.dwarf_18bb43::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_128,ptVar3,&local_530,(string *)local_408);
  if (local_40._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_40,local_40._M_head_impl);
  }
  local_40._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((mutex_type *)local_408._0_8_ != pmVar1) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  ptVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_408._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"c","");
  anon_unknown.dwarf_18bb43::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_220,ptVar3,&local_530,(string *)local_408);
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_138._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,local_138._M_head_impl);
  }
  local_138._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((mutex_type *)local_408._0_8_ != pmVar1) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  ptVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  pdVar2 = (database_reference)(local_628 + 0x10);
  local_628 = (undefined1  [8])pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"a","");
  piVar8 = (iterator_base<false> *)local_628;
  anon_unknown.dwarf_18bb43::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_408,ptVar3,&local_530,(string *)piVar8);
  if (local_628 != (undefined1  [8])pdVar2) {
    operator_delete((void *)local_628,local_618[0]._M_allocated_capacity + 1);
  }
  local_4f8[0] = local_318;
  local_4f0.internal_ = (internal_node *)0x0;
  if (local_318 == false) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_628,(internal *)local_4f8,(AssertionResult *)"itp.second","false",
               "true",in_R9);
    piVar8 = (iterator_base<false> *)0x392;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x392,(char *)local_628);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_690,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_690);
    if (local_628 != (undefined1  [8])pdVar2) {
      operator_delete((void *)local_628,local_618[0]._M_allocated_capacity + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_310._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0.internal_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4f8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4f0.internal_);
    }
  }
  local_4f8 = (undefined1  [8])local_408._0_8_;
  memcpy(local_4f8 + 8,local_408 + 8,0xd8);
  local_418 = local_328;
  local_630 = (default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_410;
  local_410._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  phVar4 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_310._0_8_ = db;
  memset(local_310 + 8,0,0xd8);
  local_228._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  local_310._224_8_ = phVar4;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            (local_628,local_4f8,(iterator_base<false> *)local_310,piVar8);
  pdVar2 = (database_reference)(local_628 + 0x10);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x395,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_628,"\"a\"","v1",(char (*) [2])0x216b11,&ppVar6->first);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x398,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_628,"\"b\"","v2",(char (*) [2])0x211c35,&ppVar6->first);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x39b,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  piVar8 = (iterator_base<false> *)0x217cb6;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_628,"\"c\"","v3",(char (*) [2])0x217cb6,&ppVar6->first);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    piVar8 = (iterator_base<false> *)0x39e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x39e,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            (local_628,local_4f8,(iterator_base<false> *)local_310,piVar8);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3a0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  phVar4 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(phVar4,&local_530.super_transaction_base,generation);
  ptVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_690 = (undefined1  [8])&local_680;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"a","");
  anon_unknown.dwarf_18bb43::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_628,ptVar3,&local_530,(string *)local_690);
  piVar8 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator=
                     ((iterator_base<false> *)local_408,(iterator_base<false> *)local_628);
  uVar7 = CONCAT71((int7)((ulong)piVar8 >> 8),local_538);
  local_318 = local_538;
  if (local_540._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_540,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_540._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
    uVar7 = extraout_RAX;
  }
  local_540._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  if (local_690 != (undefined1  [8])&local_680) {
    operator_delete((void *)local_690,local_680._M_allocated_capacity + 1);
    uVar7 = extraout_RAX_00;
  }
  piVar8 = (iterator_base<false> *)(CONCAT71((int7)((ulong)uVar7 >> 8),local_318) & 0xffffffff ^ 1);
  local_690[0] = (string)(char)piVar8;
  local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_318 != false) {
    testing::Message::Message((Message *)local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_628,(internal *)local_690,(AssertionResult *)"itp.second","true",
               "false",in_R9);
    piVar8 = (iterator_base<false> *)0x3a6;
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3a6,(char *)local_628);
    testing::internal::AssertHelper::operator=(&local_670,(Message *)local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    if (local_628 != (undefined1  [8])pdVar2) {
      operator_delete((void *)local_628,local_618[0]._M_allocated_capacity + 1);
    }
    if (local_658 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_658 + 8))();
    }
    if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_688,local_688);
    }
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator=
            ((iterator_base<false> *)local_4f8,(iterator_base<false> *)local_408);
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            (local_628,(char *)local_4f8,(iterator_base<false> *)local_310,piVar8);
  if (local_628[0] == (string)0x0) {
    testing::Message::Message((Message *)local_690);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)((local_620.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3a9,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_658,(Message *)local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_658);
    if (local_690 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_690 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_628 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_620.internal_);
  }
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  pcVar5 = (ppVar6->first)._M_dataplus._M_p;
  local_628 = (undefined1  [8])pdVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_628,pcVar5,pcVar5 + (ppVar6->first)._M_string_length);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_690,"\"a\"","v5",(char (*) [2])0x216b11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628);
  if (local_690[0] == (string)0x0) {
    testing::Message::Message((Message *)local_658);
    if (local_688 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_688->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3ac,pcVar9);
    testing::internal::AssertHelper::operator=(&local_670,(Message *)local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    if (local_658 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_658 + 8))();
    }
  }
  if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_688,local_688);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  pcVar5 = (ppVar6->first)._M_dataplus._M_p;
  local_690 = (undefined1  [8])&local_680;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_690,pcVar5,pcVar5 + (ppVar6->first)._M_string_length);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_658,"\"b\"","v6",(char (*) [2])0x211c35,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690);
  if (local_658[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_670);
    if (local_650 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_650->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3af,pcVar9);
    testing::internal::AssertHelper::operator=(&local_660,(Message *)&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    if ((long *)CONCAT71(local_670.data_._1_7_,local_670.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_670.data_._1_7_,local_670.data_._0_1_) + 8))();
    }
  }
  if (local_650 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_658 + 8),local_650);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  ppVar6 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_4f8);
  pcVar5 = (ppVar6->first)._M_dataplus._M_p;
  local_658 = (undefined1  [8])&local_648;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_658,pcVar5,pcVar5 + (ppVar6->first)._M_string_length);
  piVar8 = (iterator_base<false> *)0x217cb6;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_670,"\"c\"","v7",(char (*) [2])0x217cb6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658);
  if (local_670.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_660);
    if (local_668 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_668->_M_dataplus)._M_p;
    }
    piVar8 = (iterator_base<false> *)0x3b2;
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3b2,pcVar9);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    if (local_660.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_660.data_ + 8))();
    }
  }
  if (local_668 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_668,local_668);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_4f8);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((char *)&local_670,local_4f8,(iterator_base<false> *)local_310,piVar8);
  if (local_670.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_660);
    if (local_668 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_668->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3b4,pcVar9);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    if (local_660.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_660.data_ + 8))();
    }
  }
  if (local_668 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_668,local_668);
  }
  if (local_658 != (undefined1  [8])&local_648) {
    operator_delete((void *)local_658,local_648._M_allocated_capacity + 1);
  }
  if (local_690 != (undefined1  [8])&local_680) {
    operator_delete((void *)local_690,local_680._M_allocated_capacity + 1);
  }
  if (local_628 != (undefined1  [8])pdVar2) {
    operator_delete((void *)local_628,local_618[0]._M_allocated_capacity + 1);
  }
  if (local_228._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_228,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_228._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )local_410._M_t.
        super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()(local_630,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_410._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_320._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_320,local_320._M_head_impl);
  }
  local_530.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340
  ;
  pstore::transaction_base::rollback(&local_530.super_transaction_base);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelOneCollisionUpsertIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "a");

    // Check trie iterator in the heap.
    EXPECT_TRUE (itp.second);
    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());

    // Check trie iterator in the store.
    itp = this->insert_or_assign (*index_, t1, "a");
    EXPECT_FALSE (itp.second);
    // Check trie iterator in the heap.
    begin = itp.first;
    EXPECT_NE (begin, end);

    std::string const v5 = begin->first;
    EXPECT_EQ ("a", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("b", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    EXPECT_EQ (begin, end);
}